

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<QList<QByteArray>>::resolve<QList<QByteArray>>
          (PromiseResolver<QList<QByteArray>> *this,QList<QByteArray> *value)

{
  QPromise<QList<QByteArray>_> *pQVar1;
  Data *pDVar2;
  PromiseData<QList<QByteArray>_> *pPVar3;
  QPromise<QList<QByteArray>_> *promise;
  QList<QByteArray> *value_local;
  PromiseResolver<QList<QByteArray>_> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QByteArray>_>::Data>
           ::operator->((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QByteArray>_>::Data>
                         *)this);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<QList<QByteArray>_> *)0x0) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<QByteArray>_>_>::
             operator->(&(pQVar1->super_QPromiseBase<QList<QByteArray>_>).m_d);
    PromiseData<QList<QByteArray>>::resolve<QList<QByteArray>>
              ((PromiseData<QList<QByteArray>> *)pPVar3,value);
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<QByteArray>_>_>::
             operator->(&(pQVar1->super_QPromiseBase<QList<QByteArray>_>).m_d);
    PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>::dispatch
              (&pPVar3->super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>);
    PromiseResolver<QList<QByteArray>_>::release((PromiseResolver<QList<QByteArray>_> *)this);
  }
  return;
}

Assistant:

void resolve(V&& value)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->resolve(std::forward<V>(value));
            promise->m_d->dispatch();
            release();
        }
    }